

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmaturePopulate.cpp
# Opt level: O2

aiNode * Assimp::ArmaturePopulate::GetArmatureRoot
                   (aiNode *bone_node,vector<aiBone_*,_std::allocator<aiBone_*>_> *bone_list)

{
  bool bVar1;
  Logger *pLVar2;
  char *local_1b0 [4];
  ostream local_190 [376];
  
  while( true ) {
    if (bone_node == (aiNode *)0x0) {
      pLVar2 = DefaultLogger::get();
      Logger::error(pLVar2,"GetArmatureRoot() can\'t find armature!");
      return (aiNode *)0x0;
    }
    bVar1 = IsBoneNode(&bone_node->mName,bone_list);
    if (!bVar1) break;
    bone_node = bone_node->mParent;
  }
  pLVar2 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[41]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
             (char (*) [41])"GetArmatureRoot() Found valid armature: ");
  std::operator<<(local_190,(bone_node->mName).data);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar2,local_1b0[0]);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return bone_node;
}

Assistant:

aiNode *ArmaturePopulate::GetArmatureRoot(aiNode *bone_node,
                                          std::vector<aiBone *> &bone_list) {
  while (bone_node) {
    if (!IsBoneNode(bone_node->mName, bone_list)) {
      ASSIMP_LOG_DEBUG_F("GetArmatureRoot() Found valid armature: ", bone_node->mName.C_Str());
      return bone_node;
    }

    bone_node = bone_node->mParent;
  }
  
  ASSIMP_LOG_ERROR("GetArmatureRoot() can't find armature!");
  
  return nullptr;
}